

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int dtype_isvalid(char *dtype)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  if (((dtype != (char *)0x0) &&
      ((((byte)*dtype - 0x3c < 3 || (*dtype == 0x7c)) && ((byte)dtype[1] - 0x53 < 0x23)))) &&
     (uVar1 = 0, (0x400498001U >> ((ulong)((byte)dtype[1] - 0x53) & 0x3f) & 1) != 0)) {
    iVar2 = atoi(dtype + 2);
    uVar1 = (uint)(iVar2 - 1U < 0x10);
  }
  return uVar1;
}

Assistant:

static int
dtype_isvalid(const char * dtype)
{
    if(!dtype)
        return 0;
    switch(dtype[0]) {
        case '<':
        case '>':
        case '|':
        case '=':
            break;
        default:
            return 0;
    }
    switch(dtype[1]) {
        case 'S':
        case 'b':
        case 'i':
        case 'f':
        case 'u':
        case 'c':
            break;
        default:
            return 0;
    }
    int width = atoi(&dtype[2]);
    if(width > 16 || width <= 0)
        return 0;
    return 1;
}